

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evutil.c
# Opt level: O3

char * evutil_inet_ntop(int af,void *src,char *dst,size_t len)

{
  long lVar1;
  undefined1 auVar2 [16];
  byte bVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  size_t sVar7;
  ulong uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  int iVar15;
  char *pcVar16;
  undefined1 auVar17 [16];
  uint16_t words [8];
  char buf [64];
  short sStack_8a;
  undefined1 local_88 [16];
  char local_78 [64];
  undefined1 local_38 [8];
  
  if (af != 10) {
    if (af != 2) {
      return (char *)0x0;
    }
    uVar4 = *src;
    uVar4 = evutil_snprintf(dst,len,"%d.%d.%d.%d",(ulong)(uVar4 & 0xff),
                            (ulong)(((uVar4 & 0xff00) << 8) >> 0x10),
                            (ulong)((uVar4 & 0xff0000) >> 0x10),uVar4 >> 0x18);
    if (len <= uVar4) {
      dst = (char *)0x0;
    }
    if ((int)uVar4 < 0) {
      return (char *)0x0;
    }
    return dst;
  }
  auVar2 = *src;
  local_88 = psllw(auVar2,8);
  auVar17._0_2_ = auVar2._0_2_ >> 8;
  auVar17._2_2_ = auVar2._2_2_ >> 8;
  auVar17._4_2_ = auVar2._4_2_ >> 8;
  auVar17._6_2_ = auVar2._6_2_ >> 8;
  auVar17._8_2_ = auVar2._8_2_ >> 8;
  auVar17._10_2_ = auVar2._10_2_ >> 8;
  auVar17._12_2_ = auVar2._12_2_ >> 8;
  auVar17._14_2_ = auVar2._14_2_ >> 8;
  local_88 = auVar17 | local_88;
  auVar2 = local_88;
  if ((local_88._0_8_ == 0) && (local_88._8_2_ == 0)) {
    if ((local_88._10_2_ == 0xffff) ||
       ((local_88._12_2_ != 0 && local_88._14_2_ != 0) && local_88._10_2_ == 0)) {
      uVar6 = (ulong)*(byte *)((long)src + 0xe);
      bVar3 = *(byte *)((long)src + 0xf);
      if (local_88._10_2_ == 0) {
        pcVar16 = "::%d.%d.%d.%d";
        uVar8 = (ulong)*(byte *)((long)src + 0xc);
        uVar14 = (ulong)*(byte *)((long)src + 0xd);
      }
      else {
        pcVar16 = "::%x:%d.%d.%d.%d";
        uVar8 = (ulong)(ushort)local_88._10_2_;
        uVar14 = (ulong)*(byte *)((long)src + 0xc);
        uVar6 = (ulong)*(byte *)((long)src + 0xd);
        bVar3 = *(byte *)((long)src + 0xe);
      }
      local_88 = auVar2;
      evutil_snprintf(local_78,0x40,pcVar16,uVar8,uVar14,uVar6,(uint)bVar3);
      goto LAB_00231f25;
    }
  }
  iVar15 = -1;
  iVar5 = 0;
  iVar10 = 0;
  do {
    lVar12 = (long)iVar10;
    iVar9 = iVar10 + 1;
    if (*(short *)(local_88 + lVar12 * 2) == 0) {
      iVar11 = 1;
      if (iVar10 < 7) {
        iVar11 = 8 - iVar10;
        lVar13 = 1;
        do {
          if (*(short *)(local_88 + lVar13 * 2 + lVar12 * 2) != 0) {
            iVar11 = (int)lVar13;
            iVar9 = iVar10 + iVar11;
            goto LAB_00231e17;
          }
          lVar1 = lVar12 + lVar13;
          lVar13 = lVar13 + 1;
        } while (lVar1 != 7);
        iVar9 = 8;
      }
LAB_00231e17:
      if (iVar5 < iVar11) {
        iVar5 = iVar11;
        iVar15 = iVar10;
      }
    }
    iVar10 = iVar9;
  } while (iVar9 < 8);
  if (iVar5 < 2) {
    iVar15 = -1;
  }
  pcVar16 = local_78;
  iVar10 = 0;
  local_88 = auVar2;
  do {
    if ((*(short *)(local_88 + (long)iVar10 * 2) == 0) && (iVar15 == iVar10)) {
      *pcVar16 = ':';
      iVar10 = iVar15;
      lVar12 = (long)iVar15;
      if (iVar15 == 0) {
        pcVar16[1] = ':';
        pcVar16 = pcVar16 + 2;
      }
      else {
        pcVar16 = pcVar16 + 1;
        if (7 < iVar15) break;
      }
      while (lVar12 = lVar12 + 1, (&sStack_8a)[lVar12] == 0) {
        iVar10 = iVar10 + 1;
        if ((int)lVar12 == 8) goto LAB_00231ecb;
      }
    }
    else {
      evutil_snprintf(pcVar16,(size_t)(local_38 + -(long)pcVar16),"%x");
      sVar7 = strlen(pcVar16);
      pcVar16 = pcVar16 + sVar7;
      if (iVar10 == 7) break;
      *pcVar16 = ':';
      pcVar16 = pcVar16 + 1;
      iVar10 = iVar10 + 1;
    }
  } while (iVar10 < 8);
LAB_00231ecb:
  *pcVar16 = '\0';
LAB_00231f25:
  sVar7 = strlen(local_78);
  if (len < sVar7) {
    return (char *)0x0;
  }
  event_strlcpy_(dst,local_78,len);
  return dst;
}

Assistant:

const char *
evutil_inet_ntop(int af, const void *src, char *dst, size_t len)
{
#if defined(EVENT__HAVE_INET_NTOP) && !defined(USE_INTERNAL_NTOP)
	return inet_ntop(af, src, dst, len);
#else
	if (af == AF_INET) {
		const struct in_addr *in = src;
		const ev_uint32_t a = ntohl(in->s_addr);
		int r;
		r = evutil_snprintf(dst, len, "%d.%d.%d.%d",
		    (int)(ev_uint8_t)((a>>24)&0xff),
		    (int)(ev_uint8_t)((a>>16)&0xff),
		    (int)(ev_uint8_t)((a>>8 )&0xff),
		    (int)(ev_uint8_t)((a    )&0xff));
		if (r<0||(size_t)r>=len)
			return NULL;
		else
			return dst;
#ifdef AF_INET6
	} else if (af == AF_INET6) {
		const struct in6_addr *addr = src;
		char buf[64], *cp;
		int longestGapLen = 0, longestGapPos = -1, i,
			curGapPos = -1, curGapLen = 0;
		ev_uint16_t words[8];
		for (i = 0; i < 8; ++i) {
			words[i] =
			    (((ev_uint16_t)addr->s6_addr[2*i])<<8) + addr->s6_addr[2*i+1];
		}
		if (words[0] == 0 && words[1] == 0 && words[2] == 0 && words[3] == 0 &&
		    words[4] == 0 && ((words[5] == 0 && words[6] && words[7]) ||
			(words[5] == 0xffff))) {
			/* This is an IPv4 address. */
			if (words[5] == 0) {
				evutil_snprintf(buf, sizeof(buf), "::%d.%d.%d.%d",
				    addr->s6_addr[12], addr->s6_addr[13],
				    addr->s6_addr[14], addr->s6_addr[15]);
			} else {
				evutil_snprintf(buf, sizeof(buf), "::%x:%d.%d.%d.%d", words[5],
				    addr->s6_addr[12], addr->s6_addr[13],
				    addr->s6_addr[14], addr->s6_addr[15]);
			}
			if (strlen(buf) > len)
				return NULL;
			strlcpy(dst, buf, len);
			return dst;
		}
		i = 0;
		while (i < 8) {
			if (words[i] == 0) {
				curGapPos = i++;
				curGapLen = 1;
				while (i<8 && words[i] == 0) {
					++i; ++curGapLen;
				}
				if (curGapLen > longestGapLen) {
					longestGapPos = curGapPos;
					longestGapLen = curGapLen;
				}
			} else {
				++i;
			}
		}
		if (longestGapLen<=1)
			longestGapPos = -1;

		cp = buf;
		for (i = 0; i < 8; ++i) {
			if (words[i] == 0 && longestGapPos == i) {
				if (i == 0)
					*cp++ = ':';
				*cp++ = ':';
				while (i < 8 && words[i] == 0)
					++i;
				--i; /* to compensate for loop increment. */
			} else {
				evutil_snprintf(cp,
								sizeof(buf)-(cp-buf), "%x", (unsigned)words[i]);
				cp += strlen(cp);
				if (i != 7)
					*cp++ = ':';
			}
		}
		*cp = '\0';
		if (strlen(buf) > len)
			return NULL;
		strlcpy(dst, buf, len);
		return dst;
#endif
	} else {
		return NULL;
	}
#endif
}